

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avs_wrapper.hpp
# Opt level: O2

void __thiscall AVSInterface::AVSWrapper<MiniDeen>::Initialize(AVSWrapper<MiniDeen> *this)

{
  PClip *this_00;
  ulong uVar1;
  float fVar2;
  size_type sVar3;
  size_type sVar4;
  IScriptEnvironment *pIVar5;
  __node_base_ptr p_Var6;
  bool bVar7;
  int iVar8;
  AVSValue *this_01;
  undefined4 extraout_var;
  AVSFetchFrameFunctor *pAVar10;
  undefined8 *puVar11;
  long lVar12;
  AVSInDelegator *pAVar13;
  DSVideoInfo *pDVar14;
  AVSValue *this_02;
  byte bVar15;
  DSVideoInfo in_stack_fffffffffffffe68;
  PClip local_140;
  AVSValue *local_138;
  AVSValue local_130;
  _Vector_base<Param,_std::allocator<Param>_> local_120;
  AVSInDelegator argument;
  DSVideoInfo input_vi;
  size_type *psVar9;
  undefined4 extraout_var_00;
  
  bVar15 = 0;
  DSVideoInfo::DSVideoInfo(&input_vi);
  this_02 = &this->_args;
  this_01 = AVSValue::operator[](this_02,0);
  bVar7 = AVSValue::IsClip(this_01);
  if (bVar7) {
    local_138 = this_02;
    AVSValue::operator[](this_02,0);
    AVSValue::AsClip((AVSValue *)&argument);
    this_00 = &this->clip;
    PClip::operator=(this_00,(PClip *)&argument);
    PClip::~PClip((PClip *)&argument);
    iVar8 = (*this_00->p->_vptr_IClip[5])();
    psVar9 = (size_type *)CONCAT44(extraout_var,iVar8);
    fVar2 = *(float *)(psVar9 + 2);
    p_Var6 = (__node_base_ptr)psVar9[4];
    sVar3 = *psVar9;
    sVar4 = psVar9[3];
    uVar1 = psVar9[1];
    DSFormat::DSFormat((DSFormat *)&argument,*(int *)((long)psVar9 + 0x14));
    argument._params_index_map._M_h._M_bucket_count = uVar1 & 0xffffffff;
    argument._params_index_map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)(uVar1 >> 0x20);
    argument._params_index_map._M_h._M_element_count = sVar3;
    argument._params_index_map._M_h._M_rehash_policy._M_max_load_factor = fVar2;
    argument._params_index_map._M_h._M_rehash_policy._4_8_ = sVar4;
    argument._params_index_map._M_h._M_single_bucket = p_Var6;
    pAVar13 = &argument;
    pDVar14 = &input_vi;
    for (lVar12 = 0xb; lVar12 != 0; lVar12 = lVar12 + -1) {
      *(_func_int ***)&pDVar14->Format = (pAVar13->super_InDelegator)._vptr_InDelegator;
      pAVar13 = (AVSInDelegator *)((long)pAVar13 + (ulong)bVar15 * -0x10 + 8);
      pDVar14 = (DSVideoInfo *)((long)pDVar14 + (ulong)bVar15 * -0x10 + 8);
    }
    pAVar10 = (AVSFetchFrameFunctor *)operator_new(0x70);
    PClip::PClip(&local_140,this_00);
    iVar8 = (*this_00->p->_vptr_IClip[5])();
    puVar11 = (undefined8 *)CONCAT44(extraout_var_00,iVar8);
    argument.super_InDelegator._vptr_InDelegator = (_func_int **)*puVar11;
    argument._args._0_8_ = puVar11[1];
    argument._args.field_2 = *(anon_union_8_9_d3d94a0b_for_AVSValue_2 *)(puVar11 + 2);
    argument._params_index_map._M_h._M_buckets = (__buckets_ptr)puVar11[3];
    argument._params_index_map._M_h._M_bucket_count = puVar11[4];
    argument._params_index_map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)puVar11[5];
    pIVar5 = this->_env;
    (pAVar10->super_FetchFrameFunctor)._vptr_FetchFrameFunctor =
         (_func_int **)&PTR_operator___00119b40;
    PClip::PClip(&pAVar10->_clip,&local_140);
    (pAVar10->_vi).num_audio_samples = argument._params_index_map._M_h._M_bucket_count;
    *(_Hash_node_base **)&(pAVar10->_vi).nchannels =
         argument._params_index_map._M_h._M_before_begin._M_nxt;
    *(anon_union_8_9_d3d94a0b_for_AVSValue_2 *)&(pAVar10->_vi).num_frames = argument._args.field_2;
    *(__buckets_ptr *)&(pAVar10->_vi).audio_samples_per_second =
         argument._params_index_map._M_h._M_buckets;
    *(_func_int ***)&pAVar10->_vi = argument.super_InDelegator._vptr_InDelegator;
    *(undefined8 *)&(pAVar10->_vi).fps_numerator = argument._args._0_8_;
    pAVar10->_env = pIVar5;
    (pAVar10->fetch_frame_mutex).super___mutex_base._M_mutex.__align = 0;
    *(undefined8 *)((long)&(pAVar10->fetch_frame_mutex).super___mutex_base._M_mutex + 8) = 0;
    *(undefined8 *)((long)&(pAVar10->fetch_frame_mutex).super___mutex_base._M_mutex + 0x10) = 0;
    (pAVar10->fetch_frame_mutex).super___mutex_base._M_mutex.__data.__list.__prev =
         (__pthread_internal_list *)0x0;
    (pAVar10->fetch_frame_mutex).super___mutex_base._M_mutex.__data.__list.__next =
         (__pthread_internal_list *)0x0;
    this->functor = pAVar10;
    PClip::~PClip(&local_140);
    this_02 = local_138;
  }
  AVSValue::AVSValue(&local_130,this_02);
  MiniDeen::Params((vector<Param,_std::allocator<Param>_> *)&local_120,&this->data);
  AVSInDelegator::AVSInDelegator
            (&argument,&local_130,(vector<Param,_std::allocator<Param>_> *)&local_120);
  std::_Vector_base<Param,_std::allocator<Param>_>::~_Vector_base(&local_120);
  AVSValue::~AVSValue(&local_130);
  pAVar10 = this->functor;
  pDVar14 = &input_vi;
  puVar11 = (undefined8 *)&stack0xfffffffffffffe68;
  for (lVar12 = 0xb; lVar12 != 0; lVar12 = lVar12 + -1) {
    *puVar11 = *(undefined8 *)&pDVar14->Format;
    pDVar14 = (DSVideoInfo *)((long)pDVar14 + (ulong)bVar15 * -0x10 + 8);
    puVar11 = puVar11 + (ulong)bVar15 * -2 + 1;
  }
  MiniDeen::Initialize
            (&this->data,&argument.super_InDelegator,in_stack_fffffffffffffe68,
             &pAVar10->super_FetchFrameFunctor);
  AVSInDelegator::~AVSInDelegator(&argument);
  return;
}

Assistant:

void Initialize()
    {
      auto input_vi = DSVideoInfo();
      if (_args[0].IsClip()) {
        clip = _args[0].AsClip();
        input_vi = DSVideoInfo(clip->GetVideoInfo());
        functor = new AVSFetchFrameFunctor(clip, clip->GetVideoInfo(), _env);
      }
      auto argument = AVSInDelegator(_args, data.Params());
      data.Initialize(&argument, input_vi, functor);
    }